

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions
          (InstanceBuilder *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  pointer ppcVar1;
  pointer ppcVar2;
  char *extension;
  char *local_30;
  
  ppcVar1 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1
      ) {
    local_30 = *ppcVar2;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&(this->info).extensions,&local_30);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(std::vector<const char*> const& extensions) {
    for (const auto extension : extensions) {
        info.extensions.push_back(extension);
    }
    return *this;
}